

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_draw.cxx
# Opt level: O2

void fl_draw(char *str,int x,int y,int w,int h,Fl_Align align,
            _func_void_char_ptr_int_int_int *callthis,Fl_Image *img,int draw_symbols)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  uint uVar7;
  int iVar8;
  Fl_Image *this;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  char *pcVar14;
  int iVar15;
  char cVar16;
  ulong uVar17;
  bool bVar18;
  bool bVar19;
  double extraout_XMM0_Qa;
  double in_XMM1_Qa;
  int local_2f0;
  int local_2e0;
  int buflen;
  char *local_280;
  double local_278;
  ulong local_270;
  ulong local_268;
  double width;
  char *linebuf;
  int local_250;
  int local_24c;
  int local_248;
  uint local_244;
  double local_240;
  char symbol [2] [255];
  
  linebuf = (char *)0x0;
  this = (Fl_Image *)0x0;
  if ((align >> 9 & 1) == 0) {
    this = img;
  }
  if (img == (Fl_Image *)0x0) {
    this = img;
  }
  symbol[0][0] = '\0';
  iVar9 = 0;
  symbol[1][0] = '\0';
  if (draw_symbols == 0) {
LAB_001e3fe6:
    local_2e0 = 0;
    local_2f0 = 0;
  }
  else {
    if (str == (char *)0x0) {
      str = (char *)0x0;
      goto LAB_001e3fe6;
    }
    local_2e0 = 0;
    if ((*str == '@') && ((str[1] & 0xbfU) != 0)) {
      uVar17 = 0;
      cVar16 = '@';
      while (cVar16 != '\0') {
        iVar4 = (int)cVar16;
        iVar10 = isspace(iVar4);
        if ((iVar10 != 0) || (0xfd < uVar17)) goto LAB_001e43d6;
        symbol[0][uVar17] = cVar16;
        lVar1 = uVar17 + 1;
        uVar17 = uVar17 + 1;
        cVar16 = str[lVar1];
      }
      iVar4 = 0;
LAB_001e43d6:
      symbol[0][uVar17] = '\0';
      iVar10 = isspace(iVar4);
      str = str + uVar17 + (iVar10 != 0);
      local_2f0 = h;
      if (w < h) {
        local_2f0 = w;
      }
    }
    else {
      local_2f0 = 0;
    }
    pcVar6 = strrchr(str,0x40);
    if (((str + 1 < pcVar6 && pcVar6 != (char *)0x0) && (pcVar6[-1] != '@')) &&
       (fl_strlcpy(symbol[1],pcVar6,0xff), local_2e0 = h, w < h)) {
      local_2e0 = w;
    }
  }
  if (((align >> 8 & 1) != 0) && (this != (Fl_Image *)0x0)) {
    iVar9 = this->w_;
  }
  local_280 = str;
  local_268 = (ulong)(uint)h;
  if (str != (char *)0x0) {
    iVar10 = 1;
    iVar4 = 0;
    do {
      str = expand_text_(str,&linebuf,0,(double)(w - (local_2e0 + local_2f0 + iVar9)),&buflen,&width
                         ,align & 0x80,draw_symbols);
      iVar12 = (int)width;
      if (width <= (double)iVar4) {
        iVar12 = iVar4;
      }
      in_XMM1_Qa = width;
      if (*str == '@') {
        if ((draw_symbols != 0) && (str[1] != '@')) goto LAB_001e40d9;
      }
      else if (*str == '\0') goto LAB_001e40d9;
      iVar10 = iVar10 + 1;
      iVar4 = iVar12;
    } while( true );
  }
  iVar10 = 0;
  iVar12 = 0;
LAB_001e40d9:
  local_278 = in_XMM1_Qa;
  if (iVar10 != 0 && (local_2e0 != 0 || local_2f0 != 0)) {
    bVar18 = local_2f0 != 0;
    local_2f0 = 0;
    if (bVar18) {
      local_2f0 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
      local_2f0 = local_2f0 * iVar10;
    }
    if (local_2e0 == 0) {
      local_2e0 = 0;
    }
    else {
      local_2e0 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
      local_2e0 = local_2e0 * iVar10;
    }
  }
  bVar18 = (align >> 8 & 1) != 0;
  bVar19 = this == (Fl_Image *)0x0;
  iVar2 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
  iVar3 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
  pcVar6 = local_280;
  iVar4 = 0;
  if (!bVar19 && !bVar18) {
    iVar4 = this->h_;
  }
  iVar11 = (int)local_268;
  if ((align & 2) == 0) {
    iVar5 = iVar3;
    if ((align & 1) == 0) {
      iVar5 = (iVar11 - (iVar3 * iVar10 + iVar4)) / 2 + iVar3;
    }
    iVar4 = iVar5 + y;
  }
  else {
    iVar4 = ((1 - iVar10) * iVar3 + iVar11 + y) - iVar4;
  }
  iVar5 = local_2e0 + local_2f0;
  if ((char)((align & 0x20) >> 5) != '\0' || (bVar19 || bVar18)) {
    local_270 = 0;
    if (this == (Fl_Image *)0x0 || (align >> 8 & 1) == 0) {
      iVar13 = 0;
      iVar12 = 0;
    }
    else {
      iVar8 = this->w_;
      if ((align & 0x20) == 0) {
        if ((align & 4) == 0) {
          if ((align & 8) == 0) {
            iVar15 = x + (w - (iVar12 + iVar5 + iVar8)) / 2 + -1;
          }
          else {
            iVar15 = ~(iVar12 + local_2e0 + iVar8) + x + w;
          }
        }
        else {
          iVar15 = x + local_2f0 + -1;
        }
        iVar12 = 0;
        iVar13 = iVar8;
      }
      else {
        if ((align & 4) == 0) {
          if ((align & 8) == 0) {
            iVar15 = iVar12 + x + local_2f0;
            iVar12 = (w - (iVar12 + iVar5 + iVar8)) / 2;
            goto LAB_001e43cc;
          }
          iVar15 = (w + x) - (local_2e0 + iVar8);
        }
        else {
          iVar15 = iVar12 + x;
          iVar12 = local_2f0;
LAB_001e43cc:
          iVar15 = iVar15 + iVar12;
        }
        iVar15 = iVar15 + 1;
        iVar13 = 0;
        iVar12 = iVar8;
      }
      iVar8 = iVar4 - iVar3;
      if ((align & 1) == 0) {
        uVar7 = ~this->h_;
        if ((align & 2) == 0) {
          uVar7 = (int)(iVar2 * iVar10 + uVar7) / 2;
        }
        else {
          iVar8 = iVar8 + iVar2 * iVar10;
        }
        iVar8 = iVar8 + uVar7;
      }
      Fl_Image::draw(this,iVar15,iVar8);
      pcVar6 = local_280;
    }
  }
  else {
    uVar7 = this->w_;
    local_270 = 0;
    if (0 < (int)uVar7) {
      local_270 = (ulong)uVar7;
    }
    if ((align & 4) == 0) {
      if ((align & 8) == 0) {
        iVar12 = (int)(w - (uVar7 + iVar5)) / 2 + x + local_2f0;
      }
      else {
        iVar12 = (w + x) - (uVar7 + local_2e0);
      }
    }
    else {
      iVar12 = local_2f0 + x;
    }
    Fl_Image::draw(this,iVar12,iVar4 - iVar3);
    iVar4 = iVar4 + this->h_;
    iVar13 = 0;
    iVar12 = 0;
  }
  if (pcVar6 != (char *)0x0) {
    iVar2 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3b])();
    local_240 = (double)(w - (iVar9 + iVar5));
    local_244 = align & 0x80;
    iVar9 = local_2f0 + x + iVar13;
    local_24c = x + w;
    local_250 = local_2e0 + iVar12;
    local_248 = iVar13 + iVar5 + iVar12;
    uVar17 = local_270;
    do {
      pcVar14 = "";
      if (1 < iVar10) {
        pcVar14 = expand_text_(pcVar6,&linebuf,0,local_240,&buflen,&width,local_244,draw_symbols);
        local_278 = width;
      }
      pcVar6 = linebuf;
      iVar12 = buflen;
      iVar11 = (int)uVar17;
      uVar7 = (uint)(local_278 + 0.5);
      uVar17 = uVar17 & 0xffffffff;
      if ((double)iVar11 < local_278) {
        uVar17 = (ulong)uVar7;
      }
      iVar8 = (int)uVar17;
      iVar11 = iVar9;
      if ((align & 4) == 0) {
        if ((align & 8) == 0) {
          iVar11 = (int)(w - (uVar7 + local_248)) / 2 + iVar9;
        }
        else {
          iVar11 = local_24c - (uVar7 + local_250);
        }
      }
      (*callthis)(linebuf,buflen,iVar11,iVar4 - iVar2);
      if ((underline_at != (char *)0x0) &&
         (underline_at < pcVar6 + iVar12 && pcVar6 <= underline_at)) {
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x37])
                  (fl_graphics_driver,pcVar6,(ulong)(uint)((int)underline_at - (int)pcVar6));
        (*callthis)("_",1,iVar11 + (int)extraout_XMM0_Qa,iVar4 - iVar2);
      }
      if (*pcVar14 == '@') {
        if (pcVar14[1] != '@') goto LAB_001e46d5;
      }
      else if (*pcVar14 == '\0') goto LAB_001e46d5;
      iVar4 = iVar4 + iVar3;
      pcVar6 = pcVar14;
    } while( true );
  }
  iVar8 = (int)local_270;
LAB_001e46f6:
  if (((align & 0x20) != 0) && (!bVar19 && !bVar18)) {
    iVar9 = this->w_;
    if (iVar8 < iVar9) {
      iVar8 = iVar9;
    }
    if ((align & 4) == 0) {
      if ((align & 8) == 0) {
        iVar9 = (w - (iVar9 + iVar5)) / 2 + x + local_2f0;
      }
      else {
        iVar9 = (w + x) - (iVar9 + local_2e0);
      }
    }
    else {
      iVar9 = local_2f0 + x;
    }
    Fl_Image::draw(this,iVar9,iVar4);
  }
  if (local_2f0 != 0) {
    iVar9 = x;
    if ((align & 4) == 0) {
      if ((align & 8) == 0) {
        iVar9 = (w - (iVar5 + iVar8)) / 2 + x;
      }
      else {
        iVar9 = (w + x) - (iVar5 + iVar8);
      }
    }
    if ((align & 2) == 0) {
      iVar10 = y;
      if ((align & 1) == 0) {
        iVar10 = (iVar11 - local_2f0) / 2 + y;
      }
    }
    else {
      iVar10 = (iVar11 + y) - local_2f0;
    }
    fl_draw_symbol(symbol[0],iVar9,iVar10,local_2f0,local_2f0,fl_graphics_driver->color_);
  }
  if (local_2e0 != 0) {
    if ((align & 4) == 0) {
      if ((align & 8) == 0) {
        iVar8 = local_2f0 + x + iVar8 + (w - (iVar5 + iVar8)) / 2;
      }
      else {
        iVar8 = (w + x) - local_2e0;
      }
    }
    else {
      iVar8 = local_2f0 + x + iVar8;
    }
    if ((align & 2) == 0) {
      if ((align & 1) == 0) {
        y = (iVar11 - local_2e0) / 2 + y;
      }
    }
    else {
      y = (iVar11 + y) - local_2e0;
    }
    fl_draw_symbol(symbol[1],iVar8,y,local_2e0,local_2e0,fl_graphics_driver->color_);
  }
  return;
LAB_001e46d5:
  iVar11 = (int)local_268;
  goto LAB_001e46f6;
}

Assistant:

void fl_draw(
    const char* str,	// the (multi-line) string
    int x, int y, int w, int h,	// bounding box
    Fl_Align align,
    void (*callthis)(const char*,int,int,int),
    Fl_Image* img, int draw_symbols)
{
  char *linebuf = NULL;
  const char* p;
  const char* e;
  int buflen;
  char symbol[2][255], *symptr;
  int symwidth[2], symoffset, symtotal, imgtotal;

  // count how many lines and put the last one into the buffer:
  int lines;
  double width;

  // if the image is set as a backdrop, ignore it here
  if (img && (align & FL_ALIGN_IMAGE_BACKDROP)) img = 0;

  symbol[0][0] = '\0';
  symwidth[0]  = 0;

  symbol[1][0] = '\0';
  symwidth[1]  = 0;

  if (draw_symbols) {
    if (str && str[0] == '@' && str[1] && str[1] != '@') {
      // Start with a symbol...
      for (symptr = symbol[0];
           *str && !isspace(*str) && symptr < (symbol[0] + sizeof(symbol[0]) - 1);
           *symptr++ = *str++) {/*empty*/}
      *symptr = '\0';
      if (isspace(*str)) str++;
      symwidth[0] = (w < h ? w : h);
    }

    if (str && (p = strrchr(str, '@')) != NULL && p > (str + 1) && p[-1] != '@') {
      strlcpy(symbol[1], p, sizeof(symbol[1]));
      symwidth[1] = (w < h ? w : h);
    }
  }

  symtotal = symwidth[0] + symwidth[1];
  imgtotal = (img && (align&FL_ALIGN_IMAGE_NEXT_TO_TEXT)) ? img->w() : 0;

  int strw = 0;
  int strh;

  if (str) {
    for (p = str, lines=0; p;) {
      e = expand_text_(p, linebuf, 0, w - symtotal - imgtotal, buflen, width,
                         align&FL_ALIGN_WRAP, draw_symbols);
      if (strw<width) strw = (int)width;
      lines++;
      if (!*e || (*e == '@' && e[1] != '@' && draw_symbols)) break;
      p = e;
    }
  } else lines = 0;

  if ((symwidth[0] || symwidth[1]) && lines) {
    if (symwidth[0]) symwidth[0] = lines * fl_height();
    if (symwidth[1]) symwidth[1] = lines * fl_height();
  }

  symtotal = symwidth[0] + symwidth[1];
  strh = lines * fl_height();

  // figure out vertical position of the first line:
  int xpos;
  int ypos;
  int height = fl_height();
  int imgvert = ((align&FL_ALIGN_IMAGE_NEXT_TO_TEXT)==0);
  int imgh = img && imgvert ? img->h() : 0;
  int imgw[2] = {0, 0};

  symoffset = 0;

  if (align & FL_ALIGN_BOTTOM) ypos = y+h-(lines-1)*height-imgh;
  else if (align & FL_ALIGN_TOP) ypos = y+height;
  else ypos = y+(h-lines*height-imgh)/2+height;

  // draw the image unless the "text over image" alignment flag is set...
  if (img && imgvert && !(align & FL_ALIGN_TEXT_OVER_IMAGE)) {
    if (img->w() > symoffset) symoffset = img->w();

    if (align & FL_ALIGN_LEFT) xpos = x + symwidth[0];
    else if (align & FL_ALIGN_RIGHT) xpos = x + w - img->w() - symwidth[1];
    else xpos = x + (w - img->w() - symtotal) / 2 + symwidth[0];

    img->draw(xpos, ypos - height);
    ypos += img->h();
  }

  // draw the image to the side of the text
  if (img && !imgvert /* && (align & !FL_ALIGN_TEXT_NEXT_TO_IMAGE)*/ ) {
    if (align & FL_ALIGN_TEXT_OVER_IMAGE) { // image is right of text
      imgw[1] = img->w();
      if (align & FL_ALIGN_LEFT) xpos = x + symwidth[0] + strw + 1;
      else if (align & FL_ALIGN_RIGHT) xpos = x + w - symwidth[1] - imgw[1] + 1;
      else xpos = x + (w - strw - symtotal - imgw[1]) / 2 + symwidth[0] + strw + 1;
    } else { // image is to the left of the text
      imgw[0] = img->w();
      if (align & FL_ALIGN_LEFT) xpos = x + symwidth[0] - 1;
      else if (align & FL_ALIGN_RIGHT) xpos = x + w - symwidth[1] - strw - imgw[0] - 1;
      else xpos = x + (w - strw - symtotal - imgw[0]) / 2 - 1;
    }
    int yimg = ypos - height;
    if (align & FL_ALIGN_TOP) ;
    else if (align & FL_ALIGN_BOTTOM) yimg += strh - img->h() - 1;
    else yimg += (strh - img->h() - 1) / 2;
    img->draw(xpos, yimg);
  }

  // now draw all the lines:
  if (str) {
    int desc = fl_descent();
    for (p=str; ; ypos += height) {
      if (lines>1) e = expand_text_(p, linebuf, 0, w - symtotal - imgtotal, buflen,
				width, align&FL_ALIGN_WRAP, draw_symbols);
      else e = "";

      if (width > symoffset) symoffset = (int)(width + 0.5);

      if (align & FL_ALIGN_LEFT) xpos = x + symwidth[0] + imgw[0];
      else if (align & FL_ALIGN_RIGHT) xpos = x + w - (int)(width + .5) - symwidth[1] - imgw[1];
      else xpos = x + (w - (int)(width + .5) - symtotal - imgw[0] - imgw[1]) / 2 + symwidth[0] + imgw[0];

      callthis(linebuf,buflen,xpos,ypos-desc);

      if (underline_at && underline_at >= linebuf && underline_at < (linebuf + buflen))
	callthis("_",1,xpos+int(fl_width(linebuf,(int) (underline_at-linebuf))),ypos-desc);

      if (!*e || (*e == '@' && e[1] != '@')) break;
      p = e;
    }
  }

  // draw the image if the "text over image" alignment flag is set...
  if (img && imgvert && (align & FL_ALIGN_TEXT_OVER_IMAGE)) {
    if (img->w() > symoffset) symoffset = img->w();

    if (align & FL_ALIGN_LEFT) xpos = x + symwidth[0];
    else if (align & FL_ALIGN_RIGHT) xpos = x + w - img->w() - symwidth[1];
    else xpos = x + (w - img->w() - symtotal) / 2 + symwidth[0];

    img->draw(xpos, ypos);
  }

  // draw the symbols, if any...
  if (symwidth[0]) {
    // draw to the left
    if (align & FL_ALIGN_LEFT) xpos = x;
    else if (align & FL_ALIGN_RIGHT) xpos = x + w - symtotal - symoffset;
    else xpos = x + (w - symoffset - symtotal) / 2;

    if (align & FL_ALIGN_BOTTOM) ypos = y + h - symwidth[0];
    else if (align & FL_ALIGN_TOP) ypos = y;
    else ypos = y + (h - symwidth[0]) / 2;

    fl_draw_symbol(symbol[0], xpos, ypos, symwidth[0], symwidth[0], fl_color());
  }

  if (symwidth[1]) {
    // draw to the right
    if (align & FL_ALIGN_LEFT) xpos = x + symoffset + symwidth[0];
    else if (align & FL_ALIGN_RIGHT) xpos = x + w - symwidth[1];
    else xpos = x + (w - symoffset - symtotal) / 2 + symoffset + symwidth[0];

    if (align & FL_ALIGN_BOTTOM) ypos = y + h - symwidth[1];
    else if (align & FL_ALIGN_TOP) ypos = y;
    else ypos = y + (h - symwidth[1]) / 2;

    fl_draw_symbol(symbol[1], xpos, ypos, symwidth[1], symwidth[1], fl_color());
  }
}